

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::record_raytracing_pipeline
          (StateRecorder *this,VkPipeline pipeline,VkRayTracingPipelineCreateInfoKHR *create_info,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,Hash custom_hash,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  mutex *pmVar5;
  VkRayTracingPipelineCreateInfoKHR *new_info;
  WorkItem local_50;
  
  for (piVar3 = (int *)create_info->pNext; piVar3 != (int *)0x0; piVar3 = *(int **)(piVar3 + 2)) {
    if (*piVar3 == 0x3ba228ba) goto LAB_0012bcd0;
  }
  piVar3 = (int *)0x0;
LAB_0012bcd0:
  if ((piVar3 == (int *)0x0) || (bVar1 = true, piVar3[4] == 0)) {
    if ((ulong)create_info->stageCount != 0) {
      uVar4 = 0;
      do {
        if (create_info->pStages[uVar4].module == (VkShaderModule)0x0) {
          for (piVar3 = (int *)create_info->pStages[uVar4].pNext; piVar3 != (int *)0x0;
              piVar3 = *(int **)(piVar3 + 2)) {
            if (*piVar3 == 0x10) goto LAB_0012bd2c;
          }
          piVar3 = (int *)0x0;
LAB_0012bd2c:
          if ((piVar3 == (int *)0x0) && (this->impl->should_record_identifier_only == false)) {
            pmVar5 = &this->impl->record_lock;
            iVar2 = pthread_mutex_lock((pthread_mutex_t *)pmVar5);
            if (iVar2 != 0) goto LAB_0012be46;
            if (pipeline != (VkPipeline)0x0) {
              Impl::push_unregister_locked<VkPipeline_T*>
                        (this->impl,VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR,pipeline)
              ;
            }
            pthread_mutex_unlock((pthread_mutex_t *)pmVar5);
            goto LAB_0012bdfc;
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != create_info->stageCount);
    }
    pmVar5 = &this->impl->record_lock;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)pmVar5);
    if (iVar2 != 0) {
LAB_0012be46:
      std::__throw_system_error(iVar2);
    }
    new_info = (VkRayTracingPipelineCreateInfoKHR *)0x0;
    bVar1 = Impl::copy_raytracing_pipeline
                      (this->impl,create_info,&this->impl->temp_allocator,base_pipelines,
                       base_pipeline_count,device,gsmcii,&new_info);
    if (bVar1) {
      local_50.type = VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR;
      local_50.create_info = new_info;
      local_50.handle = (uint64_t)pipeline;
      local_50.custom_hash = custom_hash;
      Impl::push_work_locked(this->impl,&local_50);
    }
    else if (pipeline != (VkPipeline)0x0) {
      Impl::push_unregister_locked<VkPipeline_T*>
                (this->impl,VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR,pipeline);
    }
    pthread_mutex_unlock((pthread_mutex_t *)pmVar5);
    if (bVar1) {
      Impl::pump_synchronized_recording(this->impl,this);
LAB_0012bdfc:
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool StateRecorder::record_raytracing_pipeline(
		VkPipeline pipeline, const VkRayTracingPipelineCreateInfoKHR &create_info,
		const VkPipeline *base_pipelines, uint32_t base_pipeline_count,
		Hash custom_hash,
		VkDevice device,
		PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)
{
	// Silently ignore if we have pipeline binaries.
	// We have no way of recording these unless we go the extra mile to
	// override the global key and add extra metadata blocks.
	// Hopefully applications are well-behaved ...
	auto *binaries = find_pnext<VkPipelineBinaryInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_BINARY_INFO_KHR, create_info.pNext);
	if (binaries && binaries->binaryCount)
		return true;

	// Ignore pipelines that cannot result in meaningful replay.
	// If we are using module identifier data + on use, we need to push it for record.
	for (uint32_t i = 0; i < create_info.stageCount; i++)
	{
		if (shader_stage_is_identifier_only(create_info.pStages[i]) &&
		    !impl->should_record_identifier_only)
		{
			std::lock_guard<std::mutex> lock(impl->record_lock);
			// Have to forget any reference if this API handle is recycled.
			if (pipeline != VK_NULL_HANDLE)
				impl->push_unregister_locked(VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR, pipeline);
			return true;
		}
	}

	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		VkRayTracingPipelineCreateInfoKHR *new_info = nullptr;
		if (!impl->copy_raytracing_pipeline(&create_info, impl->temp_allocator,
		                                    base_pipelines, base_pipeline_count,
		                                    device, gsmcii,
		                                    &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			if (pipeline != VK_NULL_HANDLE)
				impl->push_unregister_locked(VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR, pipeline);
			return false;
		}

		impl->push_work_locked({VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR,
		                        api_object_cast<uint64_t>(pipeline), new_info, custom_hash});
	}

	impl->pump_synchronized_recording(this);
	return true;
}